

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase149::run(TestCase149 *this)

{
  TestObject *pTVar1;
  int iVar2;
  RemoveConst<kj::(anonymous_namespace)::TestObject> *this_00;
  RemoveConst<kj::(anonymous_namespace)::TestObject> *pRVar3;
  size_t sVar4;
  Array<kj::(anonymous_namespace)::TestObject> result;
  ArrayBuilder<kj::(anonymous_namespace)::TestObject> local_68;
  Array<kj::(anonymous_namespace)::TestObject> array;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  array.ptr = (TestObject *)0x0;
  array.size_ = 0;
  array.disposer = (ArrayDisposer *)0x0;
  heapArrayBuilder<kj::(anonymous_namespace)::TestObject>(&local_68,0x20);
  iVar2 = 0;
  this_00 = local_68.pos;
  pRVar3 = local_68.pos;
  while (result.ptr = (TestObject *)CONCAT44(result.ptr._4_4_,iVar2), iVar2 < 0x20) {
    if ((iVar2 != (anonymous_namespace)::TestObject::count) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44],int&,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x9f,ERROR,
                 "\"failed: expected \" \"(i) == (TestObject::count)\", i, TestObject::count",
                 (char (*) [44])"failed: expected (i) == (TestObject::count)",(int *)&result,
                 &(anonymous_namespace)::TestObject::count);
    }
    TestObject::TestObject(this_00);
    this_00 = this_00 + 1;
    pRVar3 = pRVar3 + 1;
    iVar2 = (int)result.ptr + 1;
  }
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    result.ptr = (TestObject *)CONCAT44(result.ptr._4_4_,0x20);
    local_68.pos = this_00;
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&result,
               &(anonymous_namespace)::TestObject::count);
  }
  pTVar1 = local_68.ptr;
  sVar4 = (long)pRVar3 - (long)local_68.ptr >> 2;
  result.ptr = local_68.ptr;
  result.disposer = local_68.disposer;
  local_68.ptr = (TestObject *)0x0;
  local_68.pos = (RemoveConst<kj::(anonymous_namespace)::TestObject> *)0x0;
  local_68.endPtr = (TestObject *)0x0;
  result.size_ = sVar4;
  Array<kj::(anonymous_namespace)::TestObject>::dispose(&array);
  array.ptr = pTVar1;
  array.disposer = local_68.disposer;
  result.ptr = (TestObject *)0x0;
  result.size_ = 0;
  array.size_ = sVar4;
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&result);
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    result.ptr = (TestObject *)CONCAT44(result.ptr._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&result,
               &(anonymous_namespace)::TestObject::count);
  }
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::~ArrayBuilder(&local_68);
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_68.ptr = (TestObject *)CONCAT44(local_68.ptr._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_68,
               &(anonymous_namespace)::TestObject::count);
  }
  Array<kj::(anonymous_namespace)::TestObject>::dispose(&array);
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_68.ptr = (TestObject *)((ulong)local_68.ptr & 0xffffffff00000000);
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_68,
               &(anonymous_namespace)::TestObject::count);
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&array);
  return;
}

Assistant:

TEST(Array, AraryBuilder) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array;

  {
    ArrayBuilder<TestObject> builder = heapArrayBuilder<TestObject>(32);

    for (int i = 0; i < 32; i++) {
      EXPECT_EQ(i, TestObject::count);
      builder.add();
    }

    EXPECT_EQ(32, TestObject::count);
    array = builder.finish();
    EXPECT_EQ(32, TestObject::count);
  }

  EXPECT_EQ(32, TestObject::count);
  array = nullptr;
  EXPECT_EQ(0, TestObject::count);
}